

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicRotorWingAircraft.h
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::GED_BasicRotorWingAircraft
          (GED_BasicRotorWingAircraft *this,GED_BasicRotorWingAircraft *param_1)

{
  KINT8 KVar1;
  KINT8 KVar2;
  KINT8 KVar3;
  GED_BasicRotorWingAircraft *param_1_local;
  GED_BasicRotorWingAircraft *this_local;
  
  GED_BasicFixedWingAircraft::GED_BasicFixedWingAircraft
            (&this->super_GED_BasicFixedWingAircraft,&param_1->super_GED_BasicFixedWingAircraft);
  (this->super_GED_BasicFixedWingAircraft).super_GED.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GED_BasicRotorWingAircraft_004f2738;
  KVar1 = param_1->m_i8GnElv;
  KVar2 = param_1->m_i8TrrtSlwRt;
  KVar3 = param_1->m_i8GnElvRt;
  this->m_i8TrrtAz = param_1->m_i8TrrtAz;
  this->m_i8GnElv = KVar1;
  this->m_i8TrrtSlwRt = KVar2;
  this->m_i8GnElvRt = KVar3;
  return;
}

Assistant:

class KDIS_EXPORT GED_BasicRotorWingAircraft : public GED_BasicFixedWingAircraft
{
protected:

    KINT8 m_i8TrrtAz;

    KINT8 m_i8GnElv;

    KINT8 m_i8TrrtSlwRt;

    KINT8 m_i8GnElvRt;

public:

    static const KUINT16 GED_BASIC_ROTOR_WING_AIRCRAFT_SIZE = 24;

    GED_BasicRotorWingAircraft();

    GED_BasicRotorWingAircraft(KDataStream &stream) noexcept(false);

    GED_BasicRotorWingAircraft( KUINT16 ID, KINT16 XOffset, KINT16 YOffset, KINT16 ZOffset, const EntityAppearance & EA, KINT8 Psi,
                                KINT8 Theta, KINT8 Phi, KUINT8 FuelStatus, KINT8 HorizontalDeviation, KINT8 VerticalDeviation,
                                KINT16 Speed, KINT8 TurretAzimuth, KINT8 GunElevation, KINT8 TurretSlewRate, KINT8 GunElevationRate );

    virtual ~GED_BasicRotorWingAircraft();

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::GetGroupedEntityCategory
    // Description: Identifies the derived GED class.
    //              Not part of the DIS PDU.
    //************************************
    virtual KDIS::DATA_TYPE::ENUMS::GroupedEntityCategory GetGroupedEntityCategory() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::GetLength
    // Description: Returns size of the GED in octets.
    //              Not part of the DIS PDU.
    //************************************
    virtual KUINT8 GetLength() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::SetTurretAzimuth
    //              KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::GetTurretAzimuth
    // Description: Turret azimuth specified in 25 milliradian increments.
    // Parameter:   KINT8 T, void
    //************************************
    void SetTurretAzimuth( KINT8 T );
    KINT8 GetTurretAzimuth() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::SetGunElevation
    //              KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::GetGunElevation
    // Description: Gun elevation specified in 25 milliradian increments.
    // Parameter:   KINT8 G, void
    //************************************
    void SetGunElevation( KINT8 G );
    KINT8 GetGunElevation() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::SetTurretSlewRate
    //              KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::GetTurretSlewRate
    // Description: Turret slew rate specified in 25 milliradian per secound increments.
    // Parameter:   KINT8 T, void
    //************************************
    void SetTurretSlewRate( KINT8 T );
    KINT8 GetTurretSlewRate() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::SetGunElevationRate
    //              KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::GetGunElevationRate
    // Description: Gun elevation rate specified in 25 milliradian per secound increments.
    // Parameter:   KINT8 G, void
    //************************************
    void SetGunElevationRate( KINT8 G );
    KINT8 GetGunElevationRate() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const GED_BasicRotorWingAircraft & Value ) const;
    KBOOL operator != ( const GED_BasicRotorWingAircraft & Value ) const;
}